

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::addKernelInfo(CLIntercept *this,cl_kernel kernel,cl_program program,string *kernelName)

{
  mutex *__mutex;
  pointer pcVar1;
  uint64_t uVar2;
  int iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  string demangledName;
  cl_program local_58;
  cl_kernel local_50;
  string local_48;
  
  __mutex = &this->m_Mutex;
  local_58 = program;
  local_50 = kernel;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    pmVar4 = std::
             map<_cl_program_*,_CLIntercept::SProgramInfo,_std::less<_cl_program_*>,_std::allocator<std::pair<_cl_program_*const,_CLIntercept::SProgramInfo>_>_>
             ::operator[](&this->m_ProgramInfoMap,&local_58);
    pmVar5 = std::
             map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
             ::operator[](&this->m_KernelInfoMap,&local_50);
    if ((this->m_Config).DemangleKernelNames == true) {
      demangle(&local_48,kernelName);
    }
    else {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar1 = (kernelName->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + kernelName->_M_string_length);
    }
    std::__cxx11::string::_M_assign((string *)pmVar5);
    uVar2 = pmVar4->OptionsHash;
    pmVar5->ProgramHash = pmVar4->ProgramHash;
    pmVar5->OptionsHash = uVar2;
    pmVar5->ProgramNumber = pmVar4->ProgramNumber;
    pmVar5->CompileCount = pmVar4->CompileCount - 1;
    addShortKernelName(this,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar6 = std::__throw_system_error(iVar3);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar6);
}

Assistant:

void CLIntercept::addKernelInfo(
    const cl_kernel kernel,
    const cl_program program,
    const std::string& kernelName )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    const SProgramInfo& programInfo = m_ProgramInfoMap[ program ];

    SKernelInfo& kernelInfo = m_KernelInfoMap[ kernel ];
    std::string demangledName = config().DemangleKernelNames ?
        demangle(kernelName) :
        kernelName;

    kernelInfo.KernelName = demangledName;

    kernelInfo.ProgramHash = programInfo.ProgramHash;
    kernelInfo.OptionsHash = programInfo.OptionsHash;

    kernelInfo.ProgramNumber = programInfo.ProgramNumber;
    kernelInfo.CompileCount = programInfo.CompileCount - 1;

    addShortKernelName( demangledName );
}